

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

CoverageBinsArraySizeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageBinsArraySizeSyntax,slang::syntax::CoverageBinsArraySizeSyntax_const&>
          (BumpAllocator *this,CoverageBinsArraySizeSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  Info *pIVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  CoverageBinsArraySizeSyntax *pCVar15;
  
  pCVar15 = (CoverageBinsArraySizeSyntax *)allocate(this,0x40,8);
  uVar6 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar7 = (args->openBracket).kind;
  uVar8 = (args->openBracket).field_0x2;
  NVar9.raw = (args->openBracket).numFlags.raw;
  uVar10 = (args->openBracket).rawLen;
  pIVar3 = (args->openBracket).info;
  pEVar4 = args->expr;
  TVar11 = (args->closeBracket).kind;
  uVar12 = (args->closeBracket).field_0x2;
  NVar13.raw = (args->closeBracket).numFlags.raw;
  uVar14 = (args->closeBracket).rawLen;
  pIVar5 = (args->closeBracket).info;
  (pCVar15->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pCVar15->super_SyntaxNode).field_0x4 = uVar6;
  (pCVar15->super_SyntaxNode).parent = pSVar1;
  (pCVar15->super_SyntaxNode).previewNode = pSVar2;
  (pCVar15->openBracket).kind = TVar7;
  (pCVar15->openBracket).field_0x2 = uVar8;
  (pCVar15->openBracket).numFlags = (NumericTokenFlags)NVar9.raw;
  (pCVar15->openBracket).rawLen = uVar10;
  (pCVar15->openBracket).info = pIVar3;
  pCVar15->expr = pEVar4;
  (pCVar15->closeBracket).kind = TVar11;
  (pCVar15->closeBracket).field_0x2 = uVar12;
  (pCVar15->closeBracket).numFlags = (NumericTokenFlags)NVar13.raw;
  (pCVar15->closeBracket).rawLen = uVar14;
  (pCVar15->closeBracket).info = pIVar5;
  return pCVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }